

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3cue-main.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *__src;
  mp3cue_track_t *__ptr;
  FILE *__stream;
  adu_t *adu;
  mp3_frame_t *frame_00;
  ulong uVar4;
  mp3cue_file_t *artist;
  ulong time;
  char *pcVar5;
  ulong time_00;
  file_t outfile;
  file_t mp3file;
  mp3cue_file_t cuefile;
  aq_t qout;
  aq_t qin;
  char outfilename [193];
  char to_buf [256];
  char from_buf [256];
  mp3_frame_t frame;
  file_t local_62c0;
  file_t local_6298;
  mp3cue_file_t local_6270;
  aq_t local_61d8;
  aq_t local_61a0;
  char local_6168 [208];
  char local_6098 [256];
  char local_5f98 [264];
  mp3_frame_t local_5e90;
  
  iVar2 = getopt(argc,argv,"c:C:");
  __src = (char *)0x0;
  while (-1 < iVar2) {
    if (iVar2 != 0x43) {
      if (iVar2 != 99) goto LAB_001045be;
      if (__src != (char *)0x0) {
        free(__src);
      }
      __src = strdup(_optarg);
    }
    iVar2 = getopt(argc,argv,"c:C:");
  }
  if (_optind == argc) {
LAB_001045be:
    puts("Usage: mp3cue -c cuefile mp3file");
    puts("-c cuefile: cut according to cue file");
    iVar2 = 0;
  }
  else {
    pcVar5 = argv[_optind];
    if (pcVar5 == (char *)0x0 || __src == (char *)0x0) {
      puts("Usage: mp3cue -c cuefile mp3file");
      puts("-c cuefile: cut according to cue file");
      iVar2 = 1;
    }
    else {
      __ptr = (mp3cue_track_t *)malloc(0xbe0);
      if (__ptr == (mp3cue_track_t *)0x0) {
        main_cold_3();
        iVar2 = 1;
        goto LAB_00104a71;
      }
      yymp3_cue_file = &local_6270;
      local_6270.track_number = 0;
      local_6270.max_track_number = 0x14;
      local_6270.tracks = __ptr;
      strncpy(local_6270.title,__src,0x40);
      __stream = fopen(__src,"r");
      if (__stream == (FILE *)0x0) {
        fprintf(_stderr,"Could not open cuefile %s\n",__src);
        iVar2 = 1;
      }
      else {
        yyin = (FILE *)__stream;
        iVar3 = yyparse();
        iVar2 = 1;
        if (iVar3 == 0) {
          iVar2 = file_open_read(&local_6298,pcVar5);
          if (iVar2 == 0) {
            fprintf(_stderr,"Could not open mp3 file: %s\n",pcVar5);
            return 0;
          }
          aq_init(&local_61a0);
          if (local_6270.track_number != 0) {
            uVar4 = 0;
            time = 0;
            do {
              iVar2 = 1;
              if ((local_6270.tracks[uVar4].performer[0] == '\0') ||
                 (local_6270.tracks[uVar4].title[0] == '\0')) {
                snprintf(local_6168,0xc0,"%02d. %s.mp3",(ulong)(uint)local_6270.tracks[uVar4].number
                         ,local_6270.title);
              }
              else {
                snprintf(local_6168,0xc0,"%02d. %s - %s.mp3",
                         (ulong)(uint)local_6270.tracks[uVar4].number,
                         local_6270.tracks[uVar4].performer,local_6270.tracks[uVar4].title);
              }
              aq_init(&local_61d8);
              iVar3 = file_open_write(&local_62c0,local_6168);
              if (iVar3 == 0) {
                fprintf(_stderr,"Could not open mp3 file: %s\n",local_6168);
                file_close(&local_6298);
                goto LAB_00104a5c;
              }
              uVar1 = ((local_6270.tracks[uVar4].index.minutes * 0x3c +
                       local_6270.tracks[uVar4].index.seconds) * 100 +
                      local_6270.tracks[uVar4].index.centiseconds) * 10;
              time_00 = (ulong)uVar1;
              format_time(time,local_5f98,0x100);
              format_time(time_00,local_6098,0x100);
              pcVar5 = local_6098;
              if (uVar1 == 0) {
                pcVar5 = "end";
              }
              printf("Extracting track %d (%s): %s - %s...\n",uVar4,local_6168,local_5f98,pcVar5);
              artist = (mp3cue_file_t *)local_6270.tracks[uVar4].performer;
              if (local_6270.tracks[uVar4].performer[0] == '\0') {
                artist = &local_6270;
              }
              iVar2 = id3_write_tag(&local_62c0,local_6270.title,artist->performer,
                                    local_6270.tracks[uVar4].title,
                                    *(uint *)(local_6270.tracks[uVar4].title + -4),
                                    "MP3 generated by mp3cue (http://bl0rg.net/software/poc/)");
              if (iVar2 == 0) {
                fprintf(_stderr,"Could not write id3 tags to file: %s\n",local_6168);
                file_close(&local_62c0);
                file_close(&local_6298);
LAB_00104a52:
                iVar2 = 1;
                goto LAB_00104a5c;
              }
              if (time < time_00) goto LAB_00104886;
              while (uVar4 == local_6270.track_number - 1) {
LAB_00104886:
                do {
                  iVar2 = mp3_next_frame(&local_6298,&local_5e90);
                  if (iVar2 < 1) {
                    if (uVar4 != local_6270.track_number - 1) {
                      main_cold_1();
                    }
                    goto LAB_001049c0;
                  }
                  iVar2 = aq_add_frame(&local_61a0,&local_5e90);
                  if (iVar2 != 0) {
                    adu = aq_get_adu(&local_61a0);
                    if (adu == (adu_t *)0x0) {
                      __assert_fail("adu != NULL",
                                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3cue-main.c"
                                    ,0xc5,"int main(int, char **)");
                    }
                    iVar2 = aq_add_adu(&local_61d8,adu);
                    if (iVar2 != 0) {
                      frame_00 = aq_get_frame(&local_61d8);
                      if (frame_00 == (mp3_frame_t *)0x0) {
                        __assert_fail("frame_out != NULL",
                                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3cue-main.c"
                                      ,0xc9,"int main(int, char **)");
                      }
                      memset(frame_00->raw,0,frame_00->si_size + 4);
                      iVar2 = mp3_fill_hdr(frame_00);
                      if (((iVar2 == 0) || (iVar2 = mp3_fill_si(frame_00), iVar2 == 0)) ||
                         (iVar2 = mp3_write_frame(&local_62c0,frame_00), iVar2 < 1)) {
                        main_cold_2();
                        goto LAB_00104a52;
                      }
                      free(frame_00);
                    }
                    free(adu);
                  }
                  time = local_5e90.usec / 1000 + time;
                } while (time < time_00);
              }
LAB_001049c0:
              file_close(&local_62c0);
              aq_destroy(&local_61d8);
              fprintf(_stderr,"%s written\n",local_6168);
              uVar4 = uVar4 + 1;
            } while (uVar4 < (local_6270._132_8_ & 0xffffffff));
          }
          file_close(&local_6298);
          aq_destroy(&local_61a0);
          iVar2 = 0;
        }
LAB_00104a5c:
        fclose(__stream);
      }
      free(__ptr);
    }
  }
  if (__src == (char *)0x0) {
    return iVar2;
  }
LAB_00104a71:
  free(__src);
  return iVar2;
}

Assistant:

int main(int argc, char *argv[]) {
    char *cuefilename = NULL,
        *mp3filename = NULL;
    int retval = EXIT_SUCCESS;
    FILE *cuein = NULL;
    mp3cue_track_t *cuetracks = NULL;

    int c;
    while ((c = getopt(argc, argv, "c:C:")) >= 0) {
        switch (c) {
        case 'c':
            if (cuefilename != NULL) {
                free(cuefilename);
            }
            cuefilename = strdup(optarg);
            break;

        case 'C':
            break;

        default:
            usage();
            goto exit;
        }
    }

    if (optind == argc) {
        usage();
        goto exit;
    }
    mp3filename = argv[optind];

    if ((cuefilename == NULL) || (mp3filename == NULL)) {
        usage();
        retval = EXIT_FAILURE;
        goto exit;
    }

    /*M
      Initialize the mp3 cue structure.
    **/
    mp3cue_file_t cuefile;
    cuetracks = malloc(sizeof(mp3cue_track_t) * MP3CUE_DEFAULT_TRACK_NUMBER);
    if (cuetracks == NULL) {
        fprintf(stderr, "Could not allocate memory for tracks\n");
        retval = EXIT_FAILURE;
        goto exit;
    }
    cuefile.tracks = cuetracks;
    cuefile.track_number = 0;
    cuefile.max_track_number = MP3CUE_DEFAULT_TRACK_NUMBER;
    yymp3_cue_file = &cuefile;
    strncpy(cuefile.title, cuefilename, MP3CUE_MAX_STRING_LENGTH);

    /*M
      Open the input file.
    **/
    cuein = fopen(cuefilename, "r");
    if (cuein == NULL) {
        fprintf(stderr, "Could not open cuefile %s\n", cuefilename);
        retval = EXIT_FAILURE;
        goto exit;
    }

    /*M
      Parse the input file.
    **/
    extern FILE *yyin;
    yyin = cuein;

    if (yyparse() != 0) {
        retval = EXIT_FAILURE;
        goto exit;
    }

    /*M
      Open the MP3 file.
    **/
    file_t mp3file;
    if (!file_open_read(&mp3file, mp3filename)) {
        fprintf(stderr, "Could not open mp3 file: %s\n", mp3filename);
        retval = EXIT_FAILURE;
        return 0;
    }

    aq_t qin;
    aq_init(&qin);

    unsigned long current = 0;

    /*M
      For each track, cut out the relevant part and save it.
    **/
    unsigned int i;
    for (i = 0; i < cuefile.track_number; i++) {
        char outfilename[MP3CUE_MAX_STRING_LENGTH * 3 + 1];
        if (strlen(cuefile.tracks[i].performer) > 0 &&
            strlen(cuefile.tracks[i].title) > 0) {
            snprintf(outfilename, MP3CUE_MAX_STRING_LENGTH * 3,
                     "%02d. %s - %s.mp3", cuefile.tracks[i].number,
                     cuefile.tracks[i].performer, cuefile.tracks[i].title);
        } else {
            snprintf(outfilename, MP3CUE_MAX_STRING_LENGTH * 3,
                     "%02d. %s.mp3", cuefile.tracks[i].number,
                     cuefile.title);
        }

        aq_t qout;
        aq_init(&qout);

        /*M
          Open the output MP3 file.
        **/
        file_t outfile;
        if (!file_open_write(&outfile, outfilename)) {
            fprintf(stderr, "Could not open mp3 file: %s\n", outfilename);
            file_close(&mp3file);
            retval = EXIT_FAILURE;
            goto exit;
        }

        /* end time in msecs */
        unsigned long end = (((cuefile.tracks[i].index.minutes * 60) +
                              cuefile.tracks[i].index.seconds) * 100 +
                             cuefile.tracks[i].index.centiseconds) * 10;
        char from_buf[256], to_buf[256];
        format_time(current, from_buf, sizeof(from_buf));
        format_time(end, to_buf, sizeof(to_buf));
        printf("Extracting track %d (%s): %s - %s...\n", i, outfilename,
               from_buf, end ? to_buf : "end");

        /* write id3 tags */
        if (!mp3cue_write_id3(&outfile, &cuefile, &cuefile.tracks[i])) {
            fprintf(stderr, "Could not write id3 tags to file: %s\n", outfilename);
            file_close(&outfile);
            file_close(&mp3file);
            retval = EXIT_FAILURE;
            goto exit;
        }

        /*M
          Read in the input file

          Read while current < end or till the end of the file if it's the last track.
        **/
        while ((current < end) || (i == (cuefile.track_number - 1))) {
            mp3_frame_t frame;
            if (mp3_next_frame(&mp3file, &frame) > 0) {
                if (aq_add_frame(&qin, &frame)) {
                    adu_t *adu = aq_get_adu(&qin);
                    assert(adu != NULL);

                    if (aq_add_adu(&qout, adu)) {
                        mp3_frame_t *frame_out = aq_get_frame(&qout);
                        assert(frame_out != NULL);

                        memset(frame_out->raw, 0, 4 + frame_out->si_size);
                        if (!mp3_fill_hdr(frame_out) ||
                            !mp3_fill_si(frame_out) ||
                            (mp3_write_frame(&outfile, frame_out) <= 0)) {
                            fprintf(stderr, "Could not write frame\n");
                            file_close(&mp3file);
                            file_close(&outfile);
                            retval = 1;
                            goto exit;
                        }

                        free(frame_out);
                    }

                    free(adu);
                }

                current += frame.usec / 1000;
            } else {
                if (i != (cuefile.track_number - 1)) {
                    fprintf(stderr, "Could not read the next frame from the mp3 file...\n");
                }
                break;
            }
        }

        /*M
          Close the output file.
        **/
        file_close(&outfile);
        aq_destroy(&qout);

        fprintf(stderr, "%s written\n", outfilename);
    }

    /*M
      Close the input file.
    **/
    file_close(&mp3file);
    aq_destroy(&qin);


    /*M
      Cleanup the data structures.
    **/
    exit:
    if (cuein != NULL) {
        fclose(cuein);
    }
    if (cuetracks != NULL) {
        free(cuetracks);
    }

    if (cuefilename != NULL) {
        free(cuefilename);
    }

    return retval;
}